

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O2

void __thiscall ast::Dir_equ::Dir_equ(Dir_equ *this,Symbol *symbol,Expression *value,Location left)

{
  string *__rhs;
  uint uVar1;
  long lVar2;
  Symbol *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  (this->super_Directive).super_Statement.location.unit = left.unit;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013b9f8;
  this->symbol = symbol;
  lVar2 = Sections::current_section;
  uVar1 = *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_index = uVar1;
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar2 + 0x30);
  (this->super_Directive).super_Statement.size_in_memory = 0;
  symbol->section = uVar1;
  symbol->type = UNDEFINED;
  symbol->value_expression = value;
  __rhs = &symbol->name;
  std::__cxx11::string::string((string *)&local_50,(string *)__rhs);
  pSVar3 = Symbols::search(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pSVar3 == (Symbol *)0x0) {
    Symbols::add(symbol);
  }
  else if (pSVar3->value_expression == (Expression *)0x0) {
    pSVar3->section = *(uint *)(Sections::current_section + 0x20);
    pSVar3->type = UNDEFINED;
    pSVar3->value_expression = value;
    std::__cxx11::string::~string((string *)__rhs);
    operator_delete(symbol);
  }
  else {
    std::operator+(&local_90,"Symbol \"",__rhs);
    std::operator+(&local_70,&local_90,"\" is already defined");
    error_report(&symbol->location,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

Dir_equ::Dir_equ(Symbol *symbol, Expression *value, Location left) :
	Directive {left}, symbol {symbol}
{
	section_index = Sections::current_section->number;	/* Um simbolo equ não pertence a uma secção ... */
	section_offset = Sections::current_section->content_size;
	size_in_memory = 0;
	symbol->set_properties(UNDEFINED, Sections::current_section->number, value);
	Symbol *s = Symbols::search(symbol->name);
	if (s == nullptr) {
		Symbols::add(symbol);
	}
	else if (s->value_expression == nullptr) {
		s->set_properties(UNDEFINED, Sections::current_section->number, value);
		delete symbol;
	}
	else
		error_report(&symbol->location, "Symbol \"" + symbol->name + "\" is already defined");
}